

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O3

bool __thiscall CPubKey::IsFullyValid(CPubKey *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t inputlen;
  uint uVar4;
  long in_FS_OFFSET;
  secp256k1_pubkey pubkey;
  secp256k1_pubkey sStack_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) == 2) {
    inputlen = 0x21;
  }
  else {
    bVar2 = false;
    if ((7 < bVar1) || (uVar4 = (uint)bVar1, bVar2 = false, (0xd0U >> (uVar4 & 0x1f) & 1) == 0))
    goto LAB_001e8e5d;
    if ((7 < uVar4) || (inputlen = 0x41, (0xd0U >> (uVar4 & 0x1f) & 1) == 0)) {
      inputlen = 0;
    }
  }
  iVar3 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&sStack_48,this->vch,inputlen);
  bVar2 = iVar3 != 0;
LAB_001e8e5d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::IsFullyValid() const {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    return secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size());
}